

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# botl.c
# Opt level: O0

int title_to_mon(char *str,int *rank_indx,int *title_length)

{
  short sVar1;
  char *pcVar2;
  int iVar3;
  size_t sVar4;
  int local_54;
  int local_30;
  int local_2c;
  int j;
  int i;
  int *title_length_local;
  int *rank_indx_local;
  char *str_local;
  
  local_2c = 0;
  do {
    if (roles[local_2c].name.m == (char *)0x0) {
      return -1;
    }
    for (local_30 = 0; local_30 < 9; local_30 = local_30 + 1) {
      if (*(long *)((long)local_2c * 0x118 + 0x3cac30 + (long)local_30 * 0x10) != 0) {
        pcVar2 = *(char **)((long)local_2c * 0x118 + 0x3cac30 + (long)local_30 * 0x10);
        sVar4 = strlen(*(char **)((long)local_2c * 0x118 + 0x3cac30 + (long)local_30 * 0x10));
        iVar3 = strncasecmp(str,pcVar2,sVar4);
        if (iVar3 == 0) {
          if (rank_indx != (int *)0x0) {
            *rank_indx = local_30;
          }
          if (title_length != (int *)0x0) {
            sVar4 = strlen(*(char **)((long)local_2c * 0x118 + 0x3cac30 + (long)local_30 * 0x10));
            *title_length = (int)sVar4;
          }
          return (int)roles[local_2c].malenum;
        }
      }
      if (roles[local_2c].rank[local_30].f != (char *)0x0) {
        pcVar2 = roles[local_2c].rank[local_30].f;
        sVar4 = strlen(roles[local_2c].rank[local_30].f);
        iVar3 = strncasecmp(str,pcVar2,sVar4);
        if (iVar3 == 0) {
          if (rank_indx != (int *)0x0) {
            *rank_indx = local_30;
          }
          if (title_length != (int *)0x0) {
            sVar4 = strlen(roles[local_2c].rank[local_30].f);
            *title_length = (int)sVar4;
          }
          if (roles[local_2c].femalenum == -1) {
            sVar1 = roles[local_2c].malenum;
          }
          else {
            sVar1 = roles[local_2c].femalenum;
          }
          local_54 = (int)sVar1;
          return local_54;
        }
      }
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

int title_to_mon(const char *str, int *rank_indx, int *title_length)
{
	int i, j;


	/* Loop through each of the roles */
	for (i = 0; roles[i].name.m; i++)
	    for (j = 0; j < 9; j++) {
	    	if (roles[i].rank[j].m && !strncmpi(str,
	    			roles[i].rank[j].m, strlen(roles[i].rank[j].m))) {
	    	    if (rank_indx) *rank_indx = j;
	    	    if (title_length) *title_length = strlen(roles[i].rank[j].m);
	    	    return roles[i].malenum;
	    	}
	    	if (roles[i].rank[j].f && !strncmpi(str,
	    			roles[i].rank[j].f, strlen(roles[i].rank[j].f))) {
	    	    if (rank_indx) *rank_indx = j;
	    	    if (title_length) *title_length = strlen(roles[i].rank[j].f);
	    	    return ((roles[i].femalenum != NON_PM) ?
	    	    		roles[i].femalenum : roles[i].malenum);
	    	}
	    }
	return NON_PM;
}